

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustr_titlecase_brkiter.cpp
# Opt level: O0

CharacterIterator * __thiscall
icu_63::WholeStringBreakIterator::getText(WholeStringBreakIterator *this)

{
  CharacterIterator *none;
  WholeStringBreakIterator *this_local;
  
  return (CharacterIterator *)0x0;
}

Assistant:

CharacterIterator &WholeStringBreakIterator::getText() const {
    U_ASSERT(FALSE);  // really should not be called
    // Returns a null reference.
    // Otherwise we would have to define a dummy CharacterIterator,
    // and either have it as a field and const_cast it to a non-const reference,
    // or have it via a pointer and return a reference to that.
    CharacterIterator *none = nullptr;
    return *none;
}